

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUHal.cpp
# Opt level: O0

bool __thiscall RTIMUHal::I2CSelectSlave(RTIMUHal *this,uchar slaveAddr,char *errorMsg)

{
  bool bVar1;
  int iVar2;
  char *errorMsg_local;
  uchar slaveAddr_local;
  RTIMUHal *this_local;
  
  if (this->m_currentSlave == slaveAddr) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = HALOpen(this);
    if (bVar1) {
      iVar2 = ioctl(this->m_I2C,0x703,(ulong)slaveAddr);
      if (iVar2 < 0) {
        fprintf(_stderr,"I2C slave select %d failed - %s\n",(ulong)slaveAddr,errorMsg);
        this_local._7_1_ = false;
      }
      else {
        this->m_currentSlave = slaveAddr;
        this_local._7_1_ = true;
      }
    }
    else {
      fprintf(_stderr,"Failed to open I2C port - %s\n",errorMsg);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMUHal::I2CSelectSlave(unsigned char slaveAddr, const char *errorMsg)
{
    if (m_currentSlave == slaveAddr)
        return true;

    if (!HALOpen()) {
        HAL_ERROR1("Failed to open I2C port - %s\n", errorMsg);
        return false;
    }

    if (ioctl(m_I2C, I2C_SLAVE, slaveAddr) < 0) {
        HAL_ERROR2("I2C slave select %d failed - %s\n", slaveAddr, errorMsg);
        return false;
    }

    m_currentSlave = slaveAddr;

    return true;
}